

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugRenderViewportThumbnail
               (ImDrawList *draw_list,ImGuiViewportP_conflict1 *viewport,ImRect *bb)

{
  undefined8 *puVar1;
  float fVar2;
  ImDrawList *pIVar3;
  ImGuiWindow *this;
  ImFont *font;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  ImGuiWindow_conflict *pIVar18;
  ImU32 IVar19;
  undefined4 extraout_EAX;
  uint uVar20;
  ulong uVar21;
  char *text_end;
  ImGuiContext_conflict1 *pIVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  ImVec4 local_f8;
  ImVec2 local_e8;
  ImVec2 IStack_e0;
  ImVec2 local_d8;
  undefined8 uStack_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  ImVec2 local_98;
  undefined8 uStack_90;
  ImVec2 *local_80;
  ImDrawList *local_78;
  ImGuiContext_conflict1 *local_70;
  ImGuiViewportP_conflict *local_68;
  ImGuiWindow_conflict *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar22 = GImGui;
  local_60 = GImGui->CurrentWindow;
  local_98 = bb->Min;
  uStack_90 = 0;
  _fStack_a0 = 0;
  local_a8._0_4_ = (bb->Max).x;
  local_a8._4_4_ = (bb->Max).y;
  local_d8 = (viewport->super_ImGuiViewport).Pos;
  uStack_d0 = 0;
  local_b8 = (viewport->super_ImGuiViewport).Size;
  uStack_b0 = 0;
  fVar2 = *(float *)(&DAT_0020ffe0 +
                    (ulong)(((uint)(viewport->super_ImGuiViewport).Flags >> 10 & 1) == 0) * 4);
  pIVar3 = local_60->DrawList;
  local_f8.x = (GImGui->Style).Colors[5].x;
  local_f8.y = (GImGui->Style).Colors[5].y;
  uVar6 = (GImGui->Style).Colors[5].z;
  uVar7 = (GImGui->Style).Colors[5].w;
  local_f8.w = fVar2 * 0.4 * (GImGui->Style).Alpha * (float)uVar7;
  local_f8.z = (float)uVar6;
  local_78 = draw_list;
  IVar19 = ColorConvertFloat4ToU32(&local_f8);
  local_80 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar3,&bb->Min,&bb->Max,IVar19,0.0,0);
  pIVar18 = local_60;
  uVar20 = (pIVar22->Windows).Size;
  if (uVar20 != 0) {
    auVar29._0_4_ = (float)local_a8._0_4_ - local_98.x;
    auVar29._4_4_ = (float)local_a8._4_4_ - local_98.y;
    auVar29._8_4_ = fStack_a0 - (float)uStack_90;
    auVar29._12_4_ = fStack_9c - uStack_90._4_4_;
    auVar17._8_8_ = uStack_b0;
    auVar17._0_4_ = local_b8.x;
    auVar17._4_4_ = local_b8.y;
    _local_a8 = divps(auVar29,auVar17);
    local_58 = local_a8._4_4_;
    local_48 = local_98.y - local_d8.y * local_58;
    uVar21 = 0;
    local_70 = pIVar22;
    local_98.y = local_48;
    local_98.x = local_98.x - local_d8.x * local_a8._0_4_;
    uStack_90 = CONCAT44(uStack_90._4_4_ - uStack_d0._4_4_ * local_a8._12_4_,
                         (float)uStack_90 - (float)uStack_d0 * local_a8._8_4_);
    local_b8 = (ImVec2)bb;
    local_68 = (ImGuiViewportP_conflict *)viewport;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    do {
      if ((long)(int)uVar20 <= (long)uVar21) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      this = (ImGuiWindow *)(pIVar22->Windows).Data[uVar21];
      if (((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) &&
         (this->Viewport == (ImGuiViewportP_conflict *)viewport)) {
        local_e8.x = (this->Pos).x;
        local_e8.y = (this->Pos).y;
        IStack_e0.x = (this->Size).x + local_e8.x;
        IStack_e0.y = (this->Size).y + local_e8.y;
        local_d8.x = local_e8.x + (this->SizeFull).x;
        uStack_d0 = 0;
        local_d8.y = local_e8.y;
        ImGuiWindow::TitleBarHeight(this);
        fVar32 = (float)(int)(local_e8.y * local_58 + local_48);
        fVar23 = (float)bb->Min;
        fVar24 = (float)((ulong)bb->Min >> 0x20);
        fVar25 = (*(ImVec2 *)((long)bb + 8)).x;
        fVar26 = (*(ImVec2 *)((long)bb + 8)).y;
        fVar30 = (float)(int)(IStack_e0.x * (float)local_a8._0_4_ + local_98.x);
        fVar31 = (float)(int)((this->Pos).y * (float)local_a8._4_4_ + local_98.y);
        fVar27 = fVar31 + 5.0;
        fVar28 = fVar24;
        if ((fVar24 <= fVar32) && (fVar28 = fVar26, fVar32 <= fVar26)) {
          fVar28 = fVar32;
        }
        fVar33 = (float)(int)(local_e8.x * (float)local_a8._0_4_ + local_98.x);
        fVar34 = (float)(int)(IStack_e0.y * (float)local_a8._4_4_ + local_98.y);
        auVar5._4_4_ = -(uint)(fVar33 < fVar23);
        auVar5._0_4_ = -(uint)(fVar33 < fVar23);
        auVar5._8_4_ = -(uint)(fVar34 < fVar24);
        auVar5._12_4_ = -(uint)(fVar34 < fVar24);
        uVar20 = movmskpd(extraout_EAX,auVar5);
        fVar32 = fVar23;
        if (((uVar20 & 1) == 0) && (fVar32 = fVar25, fVar33 <= fVar25)) {
          fVar32 = fVar33;
        }
        local_e8.y = fVar28;
        local_e8.x = fVar32;
        fVar28 = fVar24;
        if (((uVar20 & 2) == 0) && (fVar28 = fVar26, fVar34 <= fVar26)) {
          fVar28 = fVar34;
        }
        auVar4._4_4_ = -(uint)(fVar30 < fVar23);
        auVar4._0_4_ = -(uint)(fVar30 < fVar23);
        auVar4._8_4_ = -(uint)(fVar31 < fVar24);
        auVar4._12_4_ = -(uint)(fVar31 < fVar24);
        uVar20 = movmskpd(uVar20,auVar4);
        fVar32 = fVar23;
        if (((uVar20 & 1) == 0) && (fVar32 = fVar25, fVar30 <= fVar25)) {
          fVar32 = fVar30;
        }
        IStack_e0.y = fVar28;
        IStack_e0.x = fVar32;
        fVar28 = fVar24;
        if (((uVar20 & 2) == 0) && (fVar28 = fVar26, fVar31 <= fVar26)) {
          fVar28 = fVar31;
        }
        fVar31 = (float)(int)((this->Pos).x * (float)local_a8._0_4_ + local_98.x);
        fVar30 = fVar25;
        if (fVar31 <= fVar25) {
          fVar30 = fVar31;
        }
        local_c8.x = (float)(-(uint)(fVar31 < fVar23) & (uint)fVar23 |
                            ~-(uint)(fVar31 < fVar23) & (uint)fVar30);
        local_c8.y = fVar28;
        if ((fVar24 <= fVar27) && (fVar24 = fVar26, fVar27 <= fVar26)) {
          fVar24 = fVar27;
        }
        fVar28 = (float)(int)(local_d8.x * (float)local_a8._0_4_ + local_98.x);
        if (fVar28 <= fVar25) {
          fVar25 = fVar28;
        }
        local_c0.y = fVar24;
        local_c0.x = (float)(-(uint)(fVar28 < fVar23) & (uint)fVar23 |
                            ~-(uint)(fVar28 < fVar23) & (uint)fVar25);
        if (pIVar22->NavWindow == (ImGuiWindow_conflict *)0x0) {
          uVar20 = 10;
        }
        else {
          uVar20 = this->RootWindowForTitleBarHighlight ==
                   (ImGuiWindow *)pIVar22->NavWindow->RootWindowForTitleBarHighlight | 10;
        }
        pIVar3 = pIVar18->DrawList;
        local_f8.x = (GImGui->Style).Colors[2].x;
        local_f8.y = (GImGui->Style).Colors[2].y;
        uVar8 = (GImGui->Style).Colors[2].z;
        uVar9 = (GImGui->Style).Colors[2].w;
        local_f8.w = (GImGui->Style).Alpha * fVar2 * (float)uVar9;
        local_f8.z = (float)uVar8;
        IVar19 = ColorConvertFloat4ToU32(&local_f8);
        ImDrawList::AddRectFilled(pIVar3,&local_e8,&IStack_e0,IVar19,0.0,0);
        pIVar3 = pIVar18->DrawList;
        puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar20 << 4));
        local_f8._0_8_ = *puVar1;
        uVar10 = puVar1[1];
        local_f8.w = (float)((ulong)uVar10 >> 0x20);
        local_f8.z = (float)uVar10;
        local_f8.w = (GImGui->Style).Alpha * fVar2 * local_f8.w;
        IVar19 = ColorConvertFloat4ToU32(&local_f8);
        ImDrawList::AddRectFilled(pIVar3,&local_c8,&local_c0,IVar19,0.0,0);
        pIVar3 = pIVar18->DrawList;
        local_f8.x = (GImGui->Style).Colors[5].x;
        local_f8.y = (GImGui->Style).Colors[5].y;
        uVar11 = (GImGui->Style).Colors[5].z;
        uVar12 = (GImGui->Style).Colors[5].w;
        local_f8.w = (GImGui->Style).Alpha * fVar2 * (float)uVar12;
        local_f8.z = (float)uVar11;
        IVar19 = ColorConvertFloat4ToU32(&local_f8);
        ImDrawList::AddRect(pIVar3,&local_e8,&IStack_e0,IVar19,0.0,0,1.0);
        pIVar22 = local_70;
        pIVar3 = pIVar18->DrawList;
        font = local_70->Font;
        local_d8.x = local_70->FontSize;
        local_f8.x = (GImGui->Style).Colors[0].x;
        local_f8.y = (GImGui->Style).Colors[0].y;
        uVar13 = (GImGui->Style).Colors[0].z;
        uVar14 = (GImGui->Style).Colors[0].w;
        local_f8.w = (GImGui->Style).Alpha * fVar2 * (float)uVar14;
        local_f8.z = (float)uVar13;
        IVar19 = ColorConvertFloat4ToU32(&local_f8);
        for (text_end = this->Name; text_end != (char *)0xffffffffffffffff; text_end = text_end + 1)
        {
          if (*text_end == '#') {
            if (text_end[1] == '#') goto LAB_001a2a63;
          }
          else if (*text_end == '\0') goto LAB_001a2a63;
        }
        text_end = (char *)0xffffffffffffffff;
LAB_001a2a63:
        ImDrawList::AddText(pIVar3,font,local_d8.x,&local_c8,IVar19,this->Name,text_end,0.0,
                            (ImVec4 *)0x0);
        uVar20 = (pIVar22->Windows).Size;
        bb = (ImRect *)local_b8;
        viewport = (ImGuiViewportP_conflict1 *)local_68;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar20);
  }
  local_f8.x = (GImGui->Style).Colors[5].x;
  local_f8.y = (GImGui->Style).Colors[5].y;
  uVar15 = (GImGui->Style).Colors[5].z;
  uVar16 = (GImGui->Style).Colors[5].w;
  local_f8.w = fVar2 * (GImGui->Style).Alpha * (float)uVar16;
  local_f8.z = (float)uVar15;
  IVar19 = ColorConvertFloat4ToU32(&local_f8);
  ImDrawList::AddRect(local_78,&bb->Min,local_80,IVar19,0.0,0,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = (viewport->Flags & ImGuiViewportFlags_Minimized) ? 0.30f : 1.00f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, ImGui::GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;
        if (thumb_window->Viewport != viewport)
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}